

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
MutatorsIRCCommand::trigger
          (MutatorsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  uint uVar7;
  string list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar5 = channel._M_str;
  sVar6 = channel._M_len;
  lVar3 = Jupiter::IRC::Client::getChannel(source,sVar6,pcVar5,pcVar5,nick._M_len,nick._M_str);
  if (lVar3 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    list._M_dataplus._M_p = (pointer)&list.field_2;
    list._M_string_length = 0;
    list.field_2._M_local_buf[0] = '\0';
    uVar7 = 0;
    while( true ) {
      RenX::getCore();
      uVar4 = RenX::Core::getServerCount();
      if (uVar4 == uVar7) break;
      uVar4 = RenX::getCore();
      lVar3 = RenX::Core::getServer(uVar4);
      cVar2 = RenX::Server::isLogChanType((int)lVar3);
      if (cVar2 != '\0') {
        s_abi_cxx11_(&local_50,"\x0303[Mutators]\x0f",0xe);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&list,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar3 + 0x48);
        for (__rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (lVar3 + 0x40); __rhs != pbVar1; __rhs = __rhs + 1) {
          s_abi_cxx11_(&local_70," ",1);
          std::operator+(&local_50,&local_70,__rhs);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&list,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
        }
        if (*(long *)(lVar3 + 0x40) == *(long *)(lVar3 + 0x48)) {
          Jupiter::IRC::Client::sendMessage(source,sVar6,pcVar5,0x12,"No mutators loaded");
        }
        else {
          Jupiter::IRC::Client::sendMessage
                    (source,sVar6,pcVar5,list._M_string_length,list._M_dataplus._M_p);
        }
      }
      uVar7 = uVar7 + 1;
    }
    if (list._M_string_length == 0) {
      Jupiter::IRC::Client::sendMessage
                (source,sVar6,pcVar5,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    std::__cxx11::string::~string((string *)&list);
  }
  return;
}

Assistant:

void MutatorsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		std::string list;
		size_t index = 0;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				list = IRCCOLOR "03[Mutators]"s IRCNORMAL;
				for (const auto& mutator : server->mutators) {
					list += " "s + mutator;
				}

				if (server->mutators.empty()) {
					source->sendMessage(channel, "No mutators loaded"sv);
				}
				else {
					source->sendMessage(channel, list);
				}
			}
		}
		if (list.empty())
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}